

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O2

FrameStatus __thiscall Http2::Frame::validateHeader(Frame *this)

{
  FrameType FVar1;
  quint32 qVar2;
  FrameFlags FVar3;
  uint uVar4;
  
  qVar2 = payloadSize(this);
  FVar1 = type(this);
  switch(FVar1) {
  case PRIORITY:
    if (qVar2 != 5) {
      return sizeError;
    }
    break;
  case RST_STREAM:
  case WINDOW_UPDATE:
    if (qVar2 != 4) {
      return sizeError;
    }
    break;
  case SETTINGS:
    FVar3 = flags(this);
    uVar4 = qVar2 % 6;
    if (((uint)FVar3.super_QFlagsStorageHelper<Http2::FrameFlag,_4>.
               super_QFlagsStorage<Http2::FrameFlag>.i & 1) != 0) {
      uVar4 = qVar2;
    }
    if (uVar4 != 0) {
      return sizeError;
    }
    break;
  case PUSH_PROMISE:
    if (qVar2 < 4) {
      return sizeError;
    }
    break;
  case PING:
    if (qVar2 != 8) {
      return sizeError;
    }
    break;
  case GOAWAY:
    if (qVar2 < 8) {
      return sizeError;
    }
  }
  return goodFrame;
}

Assistant:

FrameStatus Frame::validateHeader() const
{
    // Should be called only on a frame with
    // a complete header.
    Q_ASSERT(buffer.size() >= frameHeaderSize);

    const auto framePayloadSize = payloadSize();
    // 4.2 Frame Size
    if (framePayloadSize > maxPayloadSize)
        return FrameStatus::sizeError;

    switch (type()) {
    case FrameType::SETTINGS:
        // SETTINGS ACK can not have any payload.
        // The payload of a SETTINGS frame consists of zero
        // or more parameters, each consisting of an unsigned
        // 16-bit setting identifier and an unsigned 32-bit value.
        // Thus the payload size must be a multiple of 6.
        if (flags().testFlag(FrameFlag::ACK) ? framePayloadSize : framePayloadSize % 6)
            return FrameStatus::sizeError;
        break;
    case FrameType::PRIORITY:
        // 6.3 PRIORITY
        if (framePayloadSize != 5)
            return FrameStatus::sizeError;
        break;
    case FrameType::PING:
        // 6.7 PING
        if (framePayloadSize != 8)
            return FrameStatus::sizeError;
        break;
    case FrameType::GOAWAY:
        // 6.8 GOAWAY
        if (framePayloadSize < 8)
            return FrameStatus::sizeError;
        break;
    case FrameType::RST_STREAM:
    case FrameType::WINDOW_UPDATE:
        // 6.4 RST_STREAM, 6.9 WINDOW_UPDATE
        if (framePayloadSize != 4)
            return FrameStatus::sizeError;
        break;
    case FrameType::PUSH_PROMISE:
        // 6.6 PUSH_PROMISE
        if (framePayloadSize < 4)
            return FrameStatus::sizeError;
        break;
    default:
        // DATA/HEADERS/CONTINUATION will be verified
        // when we have payload.
        // Frames of unknown types are ignored (5.1)
        break;
    }

    return FrameStatus::goodFrame;
}